

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte bVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  UninterpretedOption_NamePart *msg;
  Rep *pRVar5;
  ulong uVar6;
  ArenaStringPtr *field_name;
  char *pcVar7;
  int iVar8;
  Arena *pAVar9;
  UnknownFieldSet *unknown;
  double *p;
  string *psVar10;
  internal *this_04;
  uint uVar11;
  char cVar12;
  uint uVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  StringPiece str;
  double *local_38;
  char *size;
  
  local_38 = (double *)ptr;
  bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  uVar11 = 0;
  if (!bVar4) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    this_01 = &this->aggregate_value_;
    this_02 = &this->string_value_;
    this_03 = &this->identifier_value_;
    uVar11 = 0;
    do {
      bVar1 = *(byte *)local_38;
      uVar13 = (uint)bVar1;
      p = (double *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar13 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if (-1 < (char)*(byte *)p) {
          p = (double *)((long)local_38 + 2);
          goto LAB_002a5c20;
        }
        pVar14 = internal::ReadTagFallback((char *)local_38,uVar13);
        p = (double *)pVar14.first;
        if (p != (double *)0x0) {
          uVar13 = pVar14.second;
          goto LAB_002a5c20;
        }
LAB_002a6008:
        local_38 = (double *)0x0;
        break;
      }
LAB_002a5c20:
      cVar12 = (char)uVar13;
      local_38 = p;
      switch(uVar13 >> 3) {
      case 2:
        if (cVar12 != '\x12') break;
        local_38 = (double *)((long)p + -1);
        do {
          local_38 = (double *)((long)local_38 + 1);
          pRVar5 = (this->name_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar8 = (this->name_).super_RepeatedPtrFieldBase.total_size_;
LAB_002a5c62:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->name_).super_RepeatedPtrFieldBase,iVar8 + 1);
            pRVar5 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = pRVar5->allocated_size;
LAB_002a5c73:
            pRVar5->allocated_size = iVar8 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
                            ((this->name_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            iVar8 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
            pRVar5->elements[iVar8] = msg;
          }
          else {
            iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            iVar8 = pRVar5->allocated_size;
            if (iVar8 <= iVar2) {
              if (iVar8 == (this->name_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002a5c62;
              goto LAB_002a5c73;
            }
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (UninterpretedOption_NamePart *)pRVar5->elements[iVar2];
          }
          local_38 = (double *)
                     internal::ParseContext::
                     ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                               (ctx,msg,(char *)local_38);
          if (local_38 == (double *)0x0) goto LAB_002a6008;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(byte *)local_38 == 0x12));
        goto LAB_002a5f83;
      case 3:
        if (cVar12 != '\x1a') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar9 & 1) != 0) {
          pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
        }
        psVar10 = this_03->ptr_;
        field_name = this_03;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_03,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_03->ptr_;
        }
        local_38 = (double *)internal::InlineGreedyStringParser(psVar10,(char *)local_38,ctx);
        this_04 = (internal *)(psVar10->_M_dataplus)._M_p;
        size = (char *)psVar10->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar7 = "google.protobuf.UninterpretedOption.identifier_value";
LAB_002a5f1f:
        str.length_ = (stringpiece_ssize_type)pcVar7;
        str.ptr_ = size;
        internal::VerifyUTF8(this_04,str,(char *)field_name);
        goto joined_r0x002a5f30;
      case 4:
        if (cVar12 == ' ') {
          uVar11 = uVar11 | 8;
          uVar6 = (ulong)(char)*(byte *)p;
          local_38 = (double *)((long)p + 1);
          if ((long)uVar6 < 0) {
            uVar13 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_38 < '\0') {
              local_38 = p;
              pVar15 = internal::VarintParseSlow64((char *)p,uVar13);
              local_38 = (double *)pVar15.first;
              this->positive_int_value_ = pVar15.second;
              goto joined_r0x002a5f30;
            }
            uVar6 = (ulong)uVar13;
            local_38 = (double *)((long)p + 2);
          }
          this->positive_int_value_ = uVar6;
          goto LAB_002a5f83;
        }
        break;
      case 5:
        if (cVar12 == '(') {
          uVar11 = uVar11 | 0x10;
          uVar6 = (ulong)(char)*(byte *)p;
          local_38 = (double *)((long)p + 1);
          if ((long)uVar6 < 0) {
            uVar13 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
            if ((char)*(byte *)local_38 < '\0') {
              local_38 = p;
              pVar15 = internal::VarintParseSlow64((char *)p,uVar13);
              local_38 = (double *)pVar15.first;
              this->negative_int_value_ = pVar15.second;
              goto joined_r0x002a5f30;
            }
            uVar6 = (ulong)uVar13;
            local_38 = (double *)((long)p + 2);
          }
          this->negative_int_value_ = uVar6;
          goto LAB_002a5f83;
        }
        break;
      case 6:
        if (cVar12 == '1') {
          uVar11 = uVar11 | 0x20;
          this->double_value_ = *p;
          local_38 = p + 1;
          goto LAB_002a5f83;
        }
        break;
      case 7:
        if (cVar12 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
          }
          psVar10 = this_02->ptr_;
          if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_02,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
            psVar10 = this_02->ptr_;
          }
          local_38 = (double *)internal::InlineGreedyStringParser(psVar10,(char *)local_38,ctx);
          goto joined_r0x002a5f30;
        }
        break;
      case 8:
        if (cVar12 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar9 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
          }
          psVar10 = this_01->ptr_;
          field_name = this_01;
          if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar9,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
            psVar10 = this_01->ptr_;
          }
          local_38 = (double *)internal::InlineGreedyStringParser(psVar10,(char *)local_38,ctx);
          this_04 = (internal *)(psVar10->_M_dataplus)._M_p;
          size = (char *)psVar10->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar7 = "google.protobuf.UninterpretedOption.aggregate_value";
          goto LAB_002a5f1f;
        }
      }
      if ((uVar13 == 0) || ((uVar13 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar13 - 1;
        break;
      }
      pvVar3 = this_00->ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
      }
      local_38 = (double *)internal::UnknownFieldParse((ulong)uVar13,unknown,(char *)local_38,ctx);
joined_r0x002a5f30:
      if (local_38 == (double *)0x0) goto LAB_002a6008;
LAB_002a5f83:
      bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar4);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar11;
  return (char *)local_38;
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_identifier_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.identifier_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          auto str = _internal_mutable_string_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          auto str = _internal_mutable_aggregate_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.UninterpretedOption.aggregate_value");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}